

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::hugeint_t>,duckdb::timestamp_t,duckdb::hugeint_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (timestamp_t *adata,AggregateInputData *aggr_input_data,hugeint_t *bdata,
               ArgMinMaxState<duckdb::timestamp_t,_duckdb::hugeint_t> **states,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *ssel,
               ValidityMask *avalidity,ValidityMask *bvalidity)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  AggregateBinaryInput local_58;
  
  local_58.left_mask = avalidity;
  local_58.right_mask = bvalidity;
  local_58.input = aggr_input_data;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = 0;
      do {
        local_58.lidx = uVar3;
        if (asel->sel_vector != (sel_t *)0x0) {
          local_58.lidx = (idx_t)asel->sel_vector[uVar3];
        }
        local_58.ridx = uVar3;
        if (bsel->sel_vector != (sel_t *)0x0) {
          local_58.ridx = (idx_t)bsel->sel_vector[uVar3];
        }
        uVar2 = uVar3;
        if (ssel->sel_vector != (sel_t *)0x0) {
          uVar2 = (ulong)ssel->sel_vector[uVar3];
        }
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<duckdb::timestamp_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  (states[uVar2],adata + local_58.lidx,bdata + local_58.ridx,&local_58);
        uVar3 = uVar3 + 1;
      } while (count != uVar3);
    }
  }
  else if (count != 0) {
    uVar3 = 0;
    do {
      local_58.lidx = uVar3;
      if (asel->sel_vector != (sel_t *)0x0) {
        local_58.lidx = (idx_t)asel->sel_vector[uVar3];
      }
      local_58.ridx = uVar3;
      if (bsel->sel_vector != (sel_t *)0x0) {
        local_58.ridx = (idx_t)bsel->sel_vector[uVar3];
      }
      uVar2 = uVar3;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)ssel->sel_vector[uVar3];
      }
      puVar1 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar1 == (unsigned_long *)0x0) ||
          ((puVar1[local_58.lidx >> 6] >> (local_58.lidx & 0x3f) & 1) != 0)) &&
         ((puVar1 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar1 == (unsigned_long *)0x0 ||
          ((puVar1[local_58.ridx >> 6] >> (local_58.ridx & 0x3f) & 1) != 0)))) {
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<duckdb::timestamp_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::timestamp_t,duckdb::hugeint_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  (states[uVar2],adata + local_58.lidx,bdata + local_58.ridx,&local_58);
      }
      uVar3 = uVar3 + 1;
    } while (count != uVar3);
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}